

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

void StoreSSE(VP8EncIterator *it)

{
  long lVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  int iVar4;
  long in_RDI;
  uint8_t *out;
  uint8_t *in;
  VP8Encoder *enc;
  
  lVar1 = *(long *)(in_RDI + 0x28);
  puVar2 = *(uint8_t **)(in_RDI + 8);
  puVar3 = *(uint8_t **)(in_RDI + 0x10);
  iVar4 = (*VP8SSE16x16)(puVar2,puVar3);
  *(long *)(lVar1 + 0x5bd8) = (long)iVar4 + *(long *)(lVar1 + 0x5bd8);
  iVar4 = (*VP8SSE8x8)(puVar2 + 0x10,puVar3 + 0x10);
  *(long *)(lVar1 + 0x5be0) = (long)iVar4 + *(long *)(lVar1 + 0x5be0);
  iVar4 = (*VP8SSE8x8)(puVar2 + 0x18,puVar3 + 0x18);
  *(long *)(lVar1 + 0x5be8) = (long)iVar4 + *(long *)(lVar1 + 0x5be8);
  *(long *)(lVar1 + 0x5bf8) = *(long *)(lVar1 + 0x5bf8) + 0x100;
  return;
}

Assistant:

static void StoreSSE(const VP8EncIterator* const it) {
  VP8Encoder* const enc = it->enc_;
  const uint8_t* const in = it->yuv_in_;
  const uint8_t* const out = it->yuv_out_;
  // Note: not totally accurate at boundary. And doesn't include in-loop filter.
  enc->sse_[0] += VP8SSE16x16(in + Y_OFF_ENC, out + Y_OFF_ENC);
  enc->sse_[1] += VP8SSE8x8(in + U_OFF_ENC, out + U_OFF_ENC);
  enc->sse_[2] += VP8SSE8x8(in + V_OFF_ENC, out + V_OFF_ENC);
  enc->sse_count_ += 16 * 16;
}